

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O2

void pztopology::TPZLine::GetSideHDivDirections
               (TPZVec<int> *sides,TPZVec<int> *dir,TPZVec<int> *bilounao)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  
  (*sides->_vptr_TPZVec[3])(sides,3);
  (*dir->_vptr_TPZVec[3])(dir,3);
  (*bilounao->_vptr_TPZVec[3])(bilounao);
  piVar1 = sides->fStore;
  piVar2 = dir->fStore;
  piVar3 = bilounao->fStore;
  for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
    *(undefined4 *)((long)piVar1 + lVar4) = *(undefined4 *)((long)&vectorsideorder + lVar4);
    *(undefined4 *)((long)piVar2 + lVar4) = 0;
    *(undefined4 *)((long)piVar3 + lVar4) = *(undefined4 *)((long)&DAT_012ee754 + lVar4);
  }
  return;
}

Assistant:

void TPZLine::GetSideHDivDirections(TPZVec<int> &sides, TPZVec<int> &dir, TPZVec<int> &bilounao)
    {
        int nsides = NumSides();
        
        sides.Resize(nsides);
        dir.Resize(nsides);
        bilounao.Resize(nsides);
        
        
        for (int is = 0; is<nsides; is++)
        {
            sides[is] = vectorsideorder[is];
            dir[is] = direcaoksioueta[is];
            bilounao[is] = bilinearounao[is];
        }
    }